

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<unsigned_char,int,6>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uchar *lhs,int *rhs,uchar *result)

{
  code *pcVar1;
  byte bVar2;
  long lVar3;
  undefined1 *in_RDX;
  int *in_RSI;
  byte *in_RDI;
  int64_t tmp;
  
  lVar3 = (ulong)*in_RDI + (long)*in_RSI;
  if (SCARRY8((ulong)*in_RDI,(long)*in_RSI)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = std::numeric_limits<unsigned_char>::max();
  if (lVar3 <= (long)(ulong)bVar2) {
    bVar2 = std::numeric_limits<unsigned_char>::min();
    if ((long)(ulong)bVar2 <= lVar3) {
      *in_RDX = (char)lVar3;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}